

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fBufferMapTests.cpp
# Opt level: O2

int __thiscall deqp::gles3::Functional::BufferMapTests::init(BufferMapTests *this,EVP_PKEY_CTX *ctx)

{
  deUint32 dVar1;
  deUint32 dVar2;
  Context *pCVar3;
  BufferPartialMapWriteCase *node;
  TestNode *pTVar4;
  TestNode *pTVar5;
  BufferMapReadCase *pBVar6;
  char *pcVar7;
  TestNode *pTVar8;
  BufferMapWriteCase *pBVar9;
  BufferMapInvalidateCase *pBVar10;
  BufferMapPartialInvalidateCase *pBVar11;
  BufferMapExplicitFlushCase *pBVar12;
  BufferMapUnsyncWriteCase *this_00;
  BufferMapReadWriteCase *pBVar13;
  deUint32 *extraout_RAX;
  deUint32 *pdVar14;
  long lVar15;
  long lVar16;
  allocator<char> local_c9;
  TestNode *local_c8;
  TestNode *local_c0;
  TestNode *local_b8;
  string name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  TestNode *local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  BufferPartialMapWriteCase *local_48;
  TestNode *local_40;
  long local_38;
  
  pTVar4 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar4,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"read",
             "Buffer read using glMapBufferRange()");
  tcu::TestNode::addChild((TestNode *)this,pTVar4);
  pTVar8 = (TestNode *)0x0;
  local_c0 = (TestNode *)this;
  local_40 = pTVar4;
  while (pTVar4 = local_40, pTVar8 != (TestNode *)0x2) {
    local_c8 = (TestNode *)(ulong)init::bufferDataSources[(long)pTVar8].write;
    local_b8 = pTVar8;
    pTVar5 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar5,((TestNode *)this)->m_testCtx,
               init::bufferDataSources[(long)pTVar8].name,glcts::fixed_sample_locations_values + 1);
    tcu::TestNode::addChild(pTVar4,pTVar5);
    for (lVar16 = 0; lVar16 != 0x20; lVar16 = lVar16 + 4) {
      dVar1 = *(deUint32 *)((long)BufferCopyTests::init::bufferTargets + lVar16);
      pBVar6 = (BufferMapReadCase *)operator_new(0xd8);
      pCVar3 = (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode;
      pcVar7 = deqp::gls::BufferTestUtil::getBufferTargetName(dVar1);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_90,pcVar7,(allocator<char> *)&local_68);
      std::operator+(&name,&local_90,"_full");
      BufferMapReadCase::BufferMapReadCase
                (pBVar6,pCVar3,name._M_dataplus._M_p,glcts::fixed_sample_locations_values + 1,dVar1,
                 0x88e5,0x3fb,0,0x3fb,(WriteType)local_c8);
      tcu::TestNode::addChild(pTVar5,(TestNode *)pBVar6);
      std::__cxx11::string::~string((string *)&name);
      std::__cxx11::string::~string((string *)&local_90);
      pBVar6 = (BufferMapReadCase *)operator_new(0xd8);
      pCVar3 = (Context *)local_c0[1]._vptr_TestNode;
      pcVar7 = deqp::gls::BufferTestUtil::getBufferTargetName(dVar1);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_90,pcVar7,(allocator<char> *)&local_68);
      std::operator+(&name,&local_90,"_partial");
      BufferMapReadCase::BufferMapReadCase
                (pBVar6,pCVar3,name._M_dataplus._M_p,glcts::fixed_sample_locations_values + 1,dVar1,
                 0x88e5,0x3fb,0x11,0x1f5,(WriteType)local_c8);
      tcu::TestNode::addChild(pTVar5,(TestNode *)pBVar6);
      std::__cxx11::string::~string((string *)&name);
      std::__cxx11::string::~string((string *)&local_90);
      this = (BufferMapTests *)local_c0;
    }
    pTVar8 = (TestNode *)((long)&local_b8->_vptr_TestNode + 1);
  }
  pTVar8 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar8,((TestNode *)this)->m_testCtx,"usage_hints",
             "Different usage hints with glMapBufferRange()");
  local_c8 = pTVar8;
  tcu::TestNode::addChild(pTVar4,pTVar8);
  pTVar4 = (TestNode *)0x0;
  while (pTVar4 != (TestNode *)0x8) {
    dVar1 = BufferCopyTests::init::bufferTargets[(long)pTVar4];
    local_b8 = pTVar4;
    for (lVar16 = 0; lVar16 != 0x24; lVar16 = lVar16 + 4) {
      dVar2 = *(deUint32 *)((long)init::usageHints + lVar16);
      pcVar7 = deqp::gls::BufferTestUtil::getBufferTargetName(dVar1);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,pcVar7,&local_c9);
      std::operator+(&local_90,&local_68,"_");
      pcVar7 = deqp::gls::BufferTestUtil::getUsageHintName(dVar2);
      std::operator+(&name,&local_90,pcVar7);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_68);
      pBVar6 = (BufferMapReadCase *)operator_new(0xd8);
      BufferMapReadCase::BufferMapReadCase
                (pBVar6,(Context *)local_c0[1]._vptr_TestNode,name._M_dataplus._M_p,
                 glcts::fixed_sample_locations_values + 1,dVar1,dVar2,0x3fb,0,0x3fb,
                 WRITE_BUFFER_SUB_DATA);
      tcu::TestNode::addChild(local_c8,(TestNode *)pBVar6);
      std::__cxx11::string::~string((string *)&name);
    }
    this = (BufferMapTests *)local_c0;
    pTVar4 = (TestNode *)((long)&local_b8->_vptr_TestNode + 1);
  }
  pTVar4 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar4,((TestNode *)this)->m_testCtx,"write",
             "Buffer write using glMapBufferRange()");
  local_70 = pTVar4;
  tcu::TestNode::addChild((TestNode *)this,pTVar4);
  lVar16 = 0;
  while (lVar16 != 3) {
    local_c8 = (TestNode *)(ulong)init::bufferUses[lVar16].verify;
    local_38 = lVar16;
    pTVar4 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar4,((TestNode *)this)->m_testCtx,init::bufferUses[lVar16].name,
               glcts::fixed_sample_locations_values + 1);
    tcu::TestNode::addChild(local_70,pTVar4);
    pTVar8 = (TestNode *)0x0;
    local_b8 = pTVar4;
    while (pTVar8 != (TestNode *)0x20) {
      dVar1 = *(deUint32 *)&pTVar8[0x37d33].m_description.field_2;
      pcVar7 = deqp::gls::BufferTestUtil::getBufferTargetName(dVar1);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,pcVar7,&local_c9);
      std::operator+(&local_90,&local_68,"_");
      pcVar7 = deqp::gls::BufferTestUtil::getUsageHintName(0x88e4);
      std::operator+(&name,&local_90,pcVar7);
      local_40 = pTVar8;
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_68);
      pBVar9 = (BufferMapWriteCase *)operator_new(0xd0);
      pCVar3 = (Context *)local_c0[1]._vptr_TestNode;
      pcVar7 = deqp::gls::BufferTestUtil::getBufferTargetName(dVar1);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,pcVar7,&local_c9);
      std::operator+(&local_90,&local_68,"_full");
      BufferMapWriteCase::BufferMapWriteCase
                (pBVar9,pCVar3,local_90._M_dataplus._M_p,glcts::fixed_sample_locations_values + 1,
                 dVar1,0x88e4,0x3fb,(VerifyType)local_c8);
      tcu::TestNode::addChild(local_b8,(TestNode *)pBVar9);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_68);
      local_48 = (BufferPartialMapWriteCase *)operator_new(0xd8);
      pCVar3 = (Context *)local_c0[1]._vptr_TestNode;
      pcVar7 = deqp::gls::BufferTestUtil::getBufferTargetName(dVar1);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,pcVar7,&local_c9);
      std::operator+(&local_90,&local_68,"_partial");
      node = local_48;
      BufferPartialMapWriteCase::BufferPartialMapWriteCase
                (local_48,pCVar3,local_90._M_dataplus._M_p,glcts::fixed_sample_locations_values + 1,
                 dVar1,0x88e4,0x3fb,0x11,0x1f5,(VerifyType)local_c8);
      tcu::TestNode::addChild(local_b8,(TestNode *)node);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_68);
      std::__cxx11::string::~string((string *)&name);
      pTVar8 = (TestNode *)((long)&local_40->_vptr_TestNode + 4);
    }
    this = (BufferMapTests *)local_c0;
    lVar16 = local_38 + 1;
  }
  pTVar8 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar8,((TestNode *)this)->m_testCtx,"usage_hints","Usage hints");
  pTVar4 = local_70;
  local_b8 = pTVar8;
  tcu::TestNode::addChild(local_70,pTVar8);
  for (lVar16 = 0; lVar16 != 8; lVar16 = lVar16 + 1) {
    local_c8 = (TestNode *)CONCAT44(local_c8._4_4_,BufferCopyTests::init::bufferTargets[lVar16]);
    for (lVar15 = 0; lVar15 != 0x24; lVar15 = lVar15 + 4) {
      dVar1 = *(deUint32 *)((long)init::usageHints + lVar15);
      pcVar7 = deqp::gls::BufferTestUtil::getBufferTargetName((deUint32)local_c8);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,pcVar7,&local_c9);
      std::operator+(&local_90,&local_68,"_");
      pcVar7 = deqp::gls::BufferTestUtil::getUsageHintName(dVar1);
      std::operator+(&name,&local_90,pcVar7);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_68);
      pBVar9 = (BufferMapWriteCase *)operator_new(0xd0);
      BufferMapWriteCase::BufferMapWriteCase
                (pBVar9,(Context *)local_c0[1]._vptr_TestNode,name._M_dataplus._M_p,
                 glcts::fixed_sample_locations_values + 1,(deUint32)local_c8,dVar1,0x3fb,
                 VERIFY_AS_VERTEX_ARRAY);
      tcu::TestNode::addChild(local_b8,(TestNode *)pBVar9);
      std::__cxx11::string::~string((string *)&name);
    }
    this = (BufferMapTests *)local_c0;
    pTVar4 = local_70;
  }
  pTVar8 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar8,((TestNode *)this)->m_testCtx,"invalidate","Buffer invalidate")
  ;
  tcu::TestNode::addChild(pTVar4,pTVar8);
  pTVar5 = (TestNode *)0x0;
  while (pTVar5 != (TestNode *)0x20) {
    dVar1 = *(deUint32 *)&pTVar5[0x37d33].m_description.field_2;
    local_c8 = pTVar5;
    pBVar10 = (BufferMapInvalidateCase *)operator_new(0xd0);
    pCVar3 = (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode;
    pcVar7 = deqp::gls::BufferTestUtil::getBufferTargetName(dVar1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,pcVar7,(allocator<char> *)&local_68);
    std::operator+(&name,&local_90,"_write_all");
    BufferMapInvalidateCase::BufferMapInvalidateCase
              (pBVar10,pCVar3,name._M_dataplus._M_p,glcts::fixed_sample_locations_values + 1,dVar1,
               0x88e4,false,VERIFY_AS_VERTEX_ARRAY);
    tcu::TestNode::addChild(pTVar8,(TestNode *)pBVar10);
    std::__cxx11::string::~string((string *)&name);
    std::__cxx11::string::~string((string *)&local_90);
    pBVar10 = (BufferMapInvalidateCase *)operator_new(0xd0);
    pCVar3 = (Context *)local_c0[1]._vptr_TestNode;
    pcVar7 = deqp::gls::BufferTestUtil::getBufferTargetName(dVar1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,pcVar7,(allocator<char> *)&local_68);
    std::operator+(&name,&local_90,"_write_partial");
    BufferMapInvalidateCase::BufferMapInvalidateCase
              (pBVar10,pCVar3,name._M_dataplus._M_p,glcts::fixed_sample_locations_values + 1,dVar1,
               0x88e4,true,VERIFY_AS_VERTEX_ARRAY);
    tcu::TestNode::addChild(pTVar8,(TestNode *)pBVar10);
    std::__cxx11::string::~string((string *)&name);
    std::__cxx11::string::~string((string *)&local_90);
    this = (BufferMapTests *)local_c0;
    pTVar4 = local_70;
    pTVar5 = (TestNode *)((long)&local_c8->_vptr_TestNode + 4);
  }
  pTVar8 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar8,((TestNode *)this)->m_testCtx,"partial_invalidate",
             "Partial invalidate");
  tcu::TestNode::addChild(pTVar4,pTVar8);
  pTVar5 = (TestNode *)0x0;
  while (pTVar5 != (TestNode *)0x20) {
    dVar1 = *(deUint32 *)&pTVar5[0x37d33].m_description.field_2;
    local_c8 = pTVar5;
    pBVar11 = (BufferMapPartialInvalidateCase *)operator_new(0xd0);
    pCVar3 = (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode;
    pcVar7 = deqp::gls::BufferTestUtil::getBufferTargetName(dVar1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,pcVar7,(allocator<char> *)&local_68);
    std::operator+(&name,&local_90,"_write_all");
    BufferMapPartialInvalidateCase::BufferMapPartialInvalidateCase
              (pBVar11,pCVar3,name._M_dataplus._M_p,glcts::fixed_sample_locations_values + 1,dVar1,
               0x88e4,false,VERIFY_AS_VERTEX_ARRAY);
    tcu::TestNode::addChild(pTVar8,(TestNode *)pBVar11);
    std::__cxx11::string::~string((string *)&name);
    std::__cxx11::string::~string((string *)&local_90);
    pBVar11 = (BufferMapPartialInvalidateCase *)operator_new(0xd0);
    pCVar3 = (Context *)local_c0[1]._vptr_TestNode;
    pcVar7 = deqp::gls::BufferTestUtil::getBufferTargetName(dVar1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,pcVar7,(allocator<char> *)&local_68);
    std::operator+(&name,&local_90,"_write_partial");
    BufferMapPartialInvalidateCase::BufferMapPartialInvalidateCase
              (pBVar11,pCVar3,name._M_dataplus._M_p,glcts::fixed_sample_locations_values + 1,dVar1,
               0x88e4,true,VERIFY_AS_VERTEX_ARRAY);
    tcu::TestNode::addChild(pTVar8,(TestNode *)pBVar11);
    std::__cxx11::string::~string((string *)&name);
    std::__cxx11::string::~string((string *)&local_90);
    this = (BufferMapTests *)local_c0;
    pTVar4 = local_70;
    pTVar5 = (TestNode *)((long)&local_c8->_vptr_TestNode + 4);
  }
  pTVar8 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar8,((TestNode *)this)->m_testCtx,"explicit_flush","Explicit flush"
            );
  tcu::TestNode::addChild(pTVar4,pTVar8);
  pTVar5 = (TestNode *)0x0;
  while (pTVar5 != (TestNode *)0x20) {
    dVar1 = *(deUint32 *)&pTVar5[0x37d33].m_description.field_2;
    local_c8 = pTVar5;
    pBVar12 = (BufferMapExplicitFlushCase *)operator_new(0xd0);
    pCVar3 = (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode;
    pcVar7 = deqp::gls::BufferTestUtil::getBufferTargetName(dVar1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,pcVar7,(allocator<char> *)&local_68);
    std::operator+(&name,&local_90,"_all");
    BufferMapExplicitFlushCase::BufferMapExplicitFlushCase
              (pBVar12,pCVar3,name._M_dataplus._M_p,glcts::fixed_sample_locations_values + 1,dVar1,
               0x88e4,false,VERIFY_AS_VERTEX_ARRAY);
    tcu::TestNode::addChild(pTVar8,(TestNode *)pBVar12);
    std::__cxx11::string::~string((string *)&name);
    std::__cxx11::string::~string((string *)&local_90);
    pBVar12 = (BufferMapExplicitFlushCase *)operator_new(0xd0);
    pCVar3 = (Context *)local_c0[1]._vptr_TestNode;
    pcVar7 = deqp::gls::BufferTestUtil::getBufferTargetName(dVar1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,pcVar7,(allocator<char> *)&local_68);
    std::operator+(&name,&local_90,"_partial");
    BufferMapExplicitFlushCase::BufferMapExplicitFlushCase
              (pBVar12,pCVar3,name._M_dataplus._M_p,glcts::fixed_sample_locations_values + 1,dVar1,
               0x88e4,true,VERIFY_AS_VERTEX_ARRAY);
    tcu::TestNode::addChild(pTVar8,(TestNode *)pBVar12);
    std::__cxx11::string::~string((string *)&name);
    std::__cxx11::string::~string((string *)&local_90);
    this = (BufferMapTests *)local_c0;
    pTVar4 = local_70;
    pTVar5 = (TestNode *)((long)&local_c8->_vptr_TestNode + 4);
  }
  pTVar8 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar8,((TestNode *)this)->m_testCtx,"unsynchronized",
             "Unsynchronized map");
  tcu::TestNode::addChild(pTVar4,pTVar8);
  for (lVar16 = 0; lVar16 != 0x20; lVar16 = lVar16 + 4) {
    dVar1 = *(deUint32 *)((long)BufferCopyTests::init::bufferTargets + lVar16);
    this_00 = (BufferMapUnsyncWriteCase *)operator_new(200);
    pCVar3 = (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode;
    pcVar7 = deqp::gls::BufferTestUtil::getBufferTargetName(dVar1);
    BufferMapUnsyncWriteCase::BufferMapUnsyncWriteCase
              (this_00,pCVar3,pcVar7,glcts::fixed_sample_locations_values + 1,dVar1,0x88e4);
    tcu::TestNode::addChild(pTVar8,(TestNode *)this_00);
    this = (BufferMapTests *)local_c0;
  }
  pTVar4 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar4,((TestNode *)this)->m_testCtx,"read_write",
             "Buffer read and write using glMapBufferRange()");
  local_48 = (BufferPartialMapWriteCase *)pTVar4;
  tcu::TestNode::addChild((TestNode *)this,pTVar4);
  pTVar4 = (TestNode *)0x0;
  while (pTVar4 != (TestNode *)0x3) {
    local_c8 = (TestNode *)(ulong)init::bufferUses[(long)pTVar4].verify;
    local_40 = pTVar4;
    pTVar8 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar8,((TestNode *)this)->m_testCtx,
               init::bufferUses[(long)pTVar4].name,glcts::fixed_sample_locations_values + 1);
    tcu::TestNode::addChild((TestNode *)local_48,pTVar8);
    pTVar4 = (TestNode *)0x0;
    while( true ) {
      if (pTVar4 == (TestNode *)0x20) break;
      dVar1 = *(deUint32 *)&pTVar4[0x37d33].m_description.field_2;
      local_b8 = pTVar4;
      pcVar7 = deqp::gls::BufferTestUtil::getBufferTargetName(dVar1);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,pcVar7,&local_c9);
      std::operator+(&local_90,&local_68,"_");
      pcVar7 = deqp::gls::BufferTestUtil::getUsageHintName(0x88e4);
      std::operator+(&name,&local_90,pcVar7);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_68);
      pBVar13 = (BufferMapReadWriteCase *)operator_new(0xd8);
      pCVar3 = (Context *)local_c0[1]._vptr_TestNode;
      pcVar7 = deqp::gls::BufferTestUtil::getBufferTargetName(dVar1);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,pcVar7,&local_c9);
      std::operator+(&local_90,&local_68,"_full");
      BufferMapReadWriteCase::BufferMapReadWriteCase
                (pBVar13,pCVar3,local_90._M_dataplus._M_p,glcts::fixed_sample_locations_values + 1,
                 dVar1,0x88e4,0x3fb,0,0x3fb,(VerifyType)local_c8);
      tcu::TestNode::addChild(pTVar8,(TestNode *)pBVar13);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_68);
      pBVar13 = (BufferMapReadWriteCase *)operator_new(0xd8);
      pCVar3 = (Context *)local_c0[1]._vptr_TestNode;
      pcVar7 = deqp::gls::BufferTestUtil::getBufferTargetName(dVar1);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,pcVar7,&local_c9);
      std::operator+(&local_90,&local_68,"_partial");
      BufferMapReadWriteCase::BufferMapReadWriteCase
                (pBVar13,pCVar3,local_90._M_dataplus._M_p,glcts::fixed_sample_locations_values + 1,
                 dVar1,0x88e4,0x3fb,0x11,0x1f5,(VerifyType)local_c8);
      tcu::TestNode::addChild(pTVar8,(TestNode *)pBVar13);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_68);
      std::__cxx11::string::~string((string *)&name);
      pTVar4 = (TestNode *)((long)&local_b8->_vptr_TestNode + 4);
    }
    this = (BufferMapTests *)local_c0;
    pTVar4 = (TestNode *)((long)&local_40->_vptr_TestNode + 1);
  }
  pTVar4 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar4,((TestNode *)this)->m_testCtx,"usage_hints","Usage hints");
  local_c8 = pTVar4;
  tcu::TestNode::addChild((TestNode *)local_48,pTVar4);
  pdVar14 = extraout_RAX;
  for (local_b8 = (TestNode *)0x0; local_b8 != (TestNode *)0x8;
      local_b8 = (TestNode *)((long)local_b8 + 1)) {
    pdVar14 = BufferCopyTests::init::bufferTargets;
    dVar1 = BufferCopyTests::init::bufferTargets[(long)local_b8];
    for (lVar16 = 0; lVar16 != 0x24; lVar16 = lVar16 + 4) {
      dVar2 = *(deUint32 *)((long)init::usageHints + lVar16);
      pcVar7 = deqp::gls::BufferTestUtil::getBufferTargetName(dVar1);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,pcVar7,&local_c9);
      std::operator+(&local_90,&local_68,"_");
      pcVar7 = deqp::gls::BufferTestUtil::getUsageHintName(dVar2);
      std::operator+(&name,&local_90,pcVar7);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_68);
      pBVar13 = (BufferMapReadWriteCase *)operator_new(0xd8);
      BufferMapReadWriteCase::BufferMapReadWriteCase
                (pBVar13,(Context *)local_c0[1]._vptr_TestNode,name._M_dataplus._M_p,
                 glcts::fixed_sample_locations_values + 1,dVar1,dVar2,0x3fb,0,0x3fb,
                 VERIFY_AS_VERTEX_ARRAY);
      tcu::TestNode::addChild(local_c8,(TestNode *)pBVar13);
      pdVar14 = (deUint32 *)std::__cxx11::string::~string((string *)&name);
    }
  }
  return (int)pdVar14;
}

Assistant:

void BufferMapTests::init (void)
{
	static const deUint32 bufferTargets[] =
	{
		GL_ARRAY_BUFFER,
		GL_COPY_READ_BUFFER,
		GL_COPY_WRITE_BUFFER,
		GL_ELEMENT_ARRAY_BUFFER,
		GL_PIXEL_PACK_BUFFER,
		GL_PIXEL_UNPACK_BUFFER,
		GL_TRANSFORM_FEEDBACK_BUFFER,
		GL_UNIFORM_BUFFER
	};

	static const deUint32 usageHints[] =
	{
		GL_STREAM_DRAW,
		GL_STREAM_READ,
		GL_STREAM_COPY,
		GL_STATIC_DRAW,
		GL_STATIC_READ,
		GL_STATIC_COPY,
		GL_DYNAMIC_DRAW,
		GL_DYNAMIC_READ,
		GL_DYNAMIC_COPY
	};

	static const struct
	{
		const char*		name;
		WriteType		write;
	} bufferDataSources[] =
	{
		{ "sub_data",		WRITE_BUFFER_SUB_DATA	},
		{ "map_write",		WRITE_BUFFER_WRITE_MAP	}
	};

	static const struct
	{
		const char*		name;
		VerifyType		verify;
	} bufferUses[] =
	{
		{ "map_read",				VERIFY_BUFFER_READ_MAP	},
		{ "render_as_vertex_array",	VERIFY_AS_VERTEX_ARRAY	},
		{ "render_as_index_array",	VERIFY_AS_INDEX_ARRAY	}
	};

	// .read
	{
		tcu::TestCaseGroup* mapReadGroup = new tcu::TestCaseGroup(m_testCtx, "read", "Buffer read using glMapBufferRange()");
		addChild(mapReadGroup);

		// .[data src]
		for (int srcNdx = 0; srcNdx < DE_LENGTH_OF_ARRAY(bufferDataSources); srcNdx++)
		{
			WriteType			write		= bufferDataSources[srcNdx].write;
			tcu::TestCaseGroup* writeGroup	= new tcu::TestCaseGroup(m_testCtx, bufferDataSources[srcNdx].name, "");
			mapReadGroup->addChild(writeGroup);

			for (int targetNdx = 0; targetNdx < DE_LENGTH_OF_ARRAY(bufferTargets); targetNdx++)
			{
				deUint32		target		= bufferTargets[targetNdx];
				const deUint32	hint		= GL_STATIC_READ;
				const int		size		= 1019;
				const int		partialOffs	= 17;
				const int		partialSize	= 501;

				writeGroup->addChild(new BufferMapReadCase(m_context, (string(getBufferTargetName(target)) + "_full").c_str(),		"", target, hint, size, 0, size, write));
				writeGroup->addChild(new BufferMapReadCase(m_context, (string(getBufferTargetName(target)) + "_partial").c_str(),	"", target, hint, size, partialOffs, partialSize, write));
			}
		}

		// .usage_hints
		{
			tcu::TestCaseGroup* hintsGroup = new tcu::TestCaseGroup(m_testCtx, "usage_hints", "Different usage hints with glMapBufferRange()");
			mapReadGroup->addChild(hintsGroup);

			for (int targetNdx = 0; targetNdx < DE_LENGTH_OF_ARRAY(bufferTargets); targetNdx++)
			{
				for (int hintNdx = 0; hintNdx < DE_LENGTH_OF_ARRAY(usageHints); hintNdx++)
				{
					deUint32		target		= bufferTargets[targetNdx];
					deUint32		hint		= usageHints[hintNdx];
					const int		size		= 1019;
					string			name		= string(getBufferTargetName(target)) + "_" + getUsageHintName(hint);

					hintsGroup->addChild(new BufferMapReadCase(m_context, name.c_str(), "", target, hint, size, 0, size, WRITE_BUFFER_SUB_DATA));
				}
			}
		}
	}

	// .write
	{
		tcu::TestCaseGroup* mapWriteGroup = new tcu::TestCaseGroup(m_testCtx, "write", "Buffer write using glMapBufferRange()");
		addChild(mapWriteGroup);

		// .[verify type]
		for (int useNdx = 0; useNdx < DE_LENGTH_OF_ARRAY(bufferUses); useNdx++)
		{
			VerifyType			verify		= bufferUses[useNdx].verify;
			tcu::TestCaseGroup* useGroup	= new tcu::TestCaseGroup(m_testCtx, bufferUses[useNdx].name, "");
			mapWriteGroup->addChild(useGroup);

			for (int targetNdx = 0; targetNdx < DE_LENGTH_OF_ARRAY(bufferTargets); targetNdx++)
			{
				deUint32		target		= bufferTargets[targetNdx];
				deUint32		hint		= GL_STATIC_DRAW;
				const int		size		= 1019;
				const int		partialOffs	= 17;
				const int		partialSize	= 501;
				string			name		= string(getBufferTargetName(target)) + "_" + getUsageHintName(hint);

				useGroup->addChild(new BufferMapWriteCase			(m_context, (string(getBufferTargetName(target)) + "_full").c_str(),	"", target, hint, size, verify));
				useGroup->addChild(new BufferPartialMapWriteCase	(m_context, (string(getBufferTargetName(target)) + "_partial").c_str(),	"", target, hint, size, partialOffs, partialSize, verify));
			}
		}

		// .usage_hints
		{
			tcu::TestCaseGroup* hintsGroup = new tcu::TestCaseGroup(m_testCtx, "usage_hints", "Usage hints");
			mapWriteGroup->addChild(hintsGroup);

			for (int targetNdx = 0; targetNdx < DE_LENGTH_OF_ARRAY(bufferTargets); targetNdx++)
			{
				for (int hintNdx = 0; hintNdx < DE_LENGTH_OF_ARRAY(usageHints); hintNdx++)
				{
					deUint32		target		= bufferTargets[targetNdx];
					deUint32		hint		= usageHints[hintNdx];
					const int		size		= 1019;
					string			name		= string(getBufferTargetName(target)) + "_" + getUsageHintName(hint);

					hintsGroup->addChild(new BufferMapWriteCase(m_context, name.c_str(), "", target, hint, size, VERIFY_AS_VERTEX_ARRAY));
				}
			}
		}

		// .invalidate
		{
			tcu::TestCaseGroup* invalidateGroup = new tcu::TestCaseGroup(m_testCtx, "invalidate", "Buffer invalidate");
			mapWriteGroup->addChild(invalidateGroup);

			for (int targetNdx = 0; targetNdx < DE_LENGTH_OF_ARRAY(bufferTargets); targetNdx++)
			{
				deUint32		target		= bufferTargets[targetNdx];
				deUint32		hint		= GL_STATIC_DRAW;

				invalidateGroup->addChild(new BufferMapInvalidateCase(m_context, (string(getBufferTargetName(target)) + "_write_all").c_str(),		"", target, hint, false,	VERIFY_AS_VERTEX_ARRAY));
				invalidateGroup->addChild(new BufferMapInvalidateCase(m_context, (string(getBufferTargetName(target)) + "_write_partial").c_str(),	"", target, hint, true,		VERIFY_AS_VERTEX_ARRAY));
			}
		}

		// .partial_invalidate
		{
			tcu::TestCaseGroup* invalidateGroup = new tcu::TestCaseGroup(m_testCtx, "partial_invalidate", "Partial invalidate");
			mapWriteGroup->addChild(invalidateGroup);

			for (int targetNdx = 0; targetNdx < DE_LENGTH_OF_ARRAY(bufferTargets); targetNdx++)
			{
				deUint32		target		= bufferTargets[targetNdx];
				deUint32		hint		= GL_STATIC_DRAW;

				invalidateGroup->addChild(new BufferMapPartialInvalidateCase(m_context, (string(getBufferTargetName(target)) + "_write_all").c_str(),		"", target, hint, false,	VERIFY_AS_VERTEX_ARRAY));
				invalidateGroup->addChild(new BufferMapPartialInvalidateCase(m_context, (string(getBufferTargetName(target)) + "_write_partial").c_str(),	"", target, hint, true,		VERIFY_AS_VERTEX_ARRAY));
			}
		}

		// .explicit_flush
		{
			tcu::TestCaseGroup* flushGroup = new tcu::TestCaseGroup(m_testCtx, "explicit_flush", "Explicit flush");
			mapWriteGroup->addChild(flushGroup);

			for (int targetNdx = 0; targetNdx < DE_LENGTH_OF_ARRAY(bufferTargets); targetNdx++)
			{
				deUint32		target		= bufferTargets[targetNdx];
				deUint32		hint		= GL_STATIC_DRAW;

				flushGroup->addChild(new BufferMapExplicitFlushCase(m_context, (string(getBufferTargetName(target)) + "_all").c_str(),		"", target, hint, false,	VERIFY_AS_VERTEX_ARRAY));
				flushGroup->addChild(new BufferMapExplicitFlushCase(m_context, (string(getBufferTargetName(target)) + "_partial").c_str(),	"", target, hint, true,		VERIFY_AS_VERTEX_ARRAY));
			}
		}

		// .unsynchronized
		{
			tcu::TestCaseGroup* unsyncGroup = new tcu::TestCaseGroup(m_testCtx, "unsynchronized", "Unsynchronized map");
			mapWriteGroup->addChild(unsyncGroup);

			for (int targetNdx = 0; targetNdx < DE_LENGTH_OF_ARRAY(bufferTargets); targetNdx++)
			{
				deUint32		target		= bufferTargets[targetNdx];
				deUint32		hint		= GL_STATIC_DRAW;

				unsyncGroup->addChild(new BufferMapUnsyncWriteCase(m_context, getBufferTargetName(target),	"", target, hint));
			}
		}
	}

	// .read_write
	{
		tcu::TestCaseGroup* mapReadWriteGroup = new tcu::TestCaseGroup(m_testCtx, "read_write", "Buffer read and write using glMapBufferRange()");
		addChild(mapReadWriteGroup);

		// .[verify type]
		for (int useNdx = 0; useNdx < DE_LENGTH_OF_ARRAY(bufferUses); useNdx++)
		{
			VerifyType			verify		= bufferUses[useNdx].verify;
			tcu::TestCaseGroup* useGroup	= new tcu::TestCaseGroup(m_testCtx, bufferUses[useNdx].name, "");
			mapReadWriteGroup->addChild(useGroup);

			for (int targetNdx = 0; targetNdx < DE_LENGTH_OF_ARRAY(bufferTargets); targetNdx++)
			{
				deUint32		target		= bufferTargets[targetNdx];
				deUint32		hint		= GL_STATIC_DRAW;
				const int		size		= 1019;
				const int		partialOffs	= 17;
				const int		partialSize	= 501;
				string			name		= string(getBufferTargetName(target)) + "_" + getUsageHintName(hint);

				useGroup->addChild(new BufferMapReadWriteCase(m_context, (string(getBufferTargetName(target)) + "_full").c_str(),		"", target, hint, size, 0, size, verify));
				useGroup->addChild(new BufferMapReadWriteCase(m_context, (string(getBufferTargetName(target)) + "_partial").c_str(),	"", target, hint, size, partialOffs, partialSize, verify));
			}
		}

		// .usage_hints
		{
			tcu::TestCaseGroup* hintsGroup = new tcu::TestCaseGroup(m_testCtx, "usage_hints", "Usage hints");
			mapReadWriteGroup->addChild(hintsGroup);

			for (int targetNdx = 0; targetNdx < DE_LENGTH_OF_ARRAY(bufferTargets); targetNdx++)
			{
				for (int hintNdx = 0; hintNdx < DE_LENGTH_OF_ARRAY(usageHints); hintNdx++)
				{
					deUint32		target		= bufferTargets[targetNdx];
					deUint32		hint		= usageHints[hintNdx];
					const int		size		= 1019;
					string			name		= string(getBufferTargetName(target)) + "_" + getUsageHintName(hint);

					hintsGroup->addChild(new BufferMapReadWriteCase(m_context, name.c_str(), "", target, hint, size, 0, size, VERIFY_AS_VERTEX_ARRAY));
				}
			}
		}
	}
}